

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O1

cmValue __thiscall
cmTargetInternals::GetFileSetDirectories
          (cmTargetInternals *this,cmTarget *self,string *fileSetName,string_view fileSetType)

{
  _Base_ptr __n;
  cmMakefile *this_00;
  int iVar1;
  iterator iVar2;
  string *psVar3;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string local_c8;
  string local_a8;
  pointer local_88;
  undefined8 local_80;
  undefined8 local_78;
  char *local_70;
  undefined8 local_68;
  _Base_ptr local_60;
  char *local_58;
  undefined8 local_50;
  undefined8 local_48;
  char *local_40;
  undefined8 local_38;
  
  iVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFileSet>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFileSet>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFileSet>_>_>
          ::find(&(((self->impl)._M_t.
                    super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                    .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->FileSets)._M_t
                 ,fileSetName);
  psVar3 = (string *)0x0;
  if (iVar2._M_node !=
      (_Base_ptr)
      ((long)&((self->impl)._M_t.
               super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>.
               _M_t.
               super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
               super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->FileSets + 8U)) {
    __n = iVar2._M_node[3]._M_left;
    if ((__n == (_Base_ptr)fileSetType._M_len) &&
       ((__n == (_Base_ptr)0x0 ||
        (iVar1 = bcmp(iVar2._M_node[3]._M_parent,fileSetType._M_str,(size_t)__n), iVar1 == 0)))) {
      if (GetFileSetDirectories(cmTarget_const*,std::__cxx11::string_const&,std::basic_string_view<char,std::char_traits<char>>)
          ::output_abi_cxx11_ == '\0') {
        GetFileSetDirectories();
      }
      cmList::
      to_string<std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_0>
                (&local_a8,
                 (vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&iVar2._M_node[4]._M_left);
      psVar3 = &GetFileSetDirectories(cmTarget_const*,std::__cxx11::string_const&,std::basic_string_view<char,std::char_traits<char>>)
                ::output_abi_cxx11_;
      std::__cxx11::string::operator=
                ((string *)
                 &GetFileSetDirectories(cmTarget_const*,std::__cxx11::string_const&,std::basic_string_view<char,std::char_traits<char>>)
                  ::output_abi_cxx11_,(string *)&local_a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      this_00 = this->Makefile;
      local_a8._M_dataplus._M_p = (pointer)0xa;
      local_a8._M_string_length = 0x7f2143;
      local_a8.field_2._M_allocated_capacity = 0;
      local_88 = (fileSetName->_M_dataplus)._M_p;
      local_a8.field_2._8_8_ = fileSetName->_M_string_length;
      local_80 = 0;
      local_78 = 0x12;
      local_70 = "\" is not of type \"";
      local_68 = 0;
      local_50 = 0;
      local_48 = 2;
      local_40 = "\".";
      local_38 = 0;
      views._M_len = 5;
      views._M_array = (iterator)&local_a8;
      local_60 = (_Base_ptr)fileSetType._M_len;
      local_58 = fileSetType._M_str;
      cmCatViews(&local_c8,views);
      cmMakefile::IssueMessage(this_00,FATAL_ERROR,&local_c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
      psVar3 = (string *)0x0;
    }
  }
  return (cmValue)psVar3;
}

Assistant:

cmValue cmTargetInternals::GetFileSetDirectories(
  cmTarget const* self, std::string const& fileSetName,
  cm::string_view fileSetType) const
{
  auto const* fileSet = self->GetFileSet(fileSetName);
  if (!fileSet) {
    return nullptr;
  }
  if (fileSet->GetType() != fileSetType) {
    this->Makefile->IssueMessage(MessageType::FATAL_ERROR,
                                 cmStrCat("File set \"", fileSetName,
                                          "\" is not of type \"", fileSetType,
                                          "\"."));
    return nullptr;
  }
  static std::string output;
  output = cmList::to_string(fileSet->GetDirectoryEntries());
  return cmValue(output);
}